

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::productTranspose
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,
          vector<double,_std::allocator<double>_> *col)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  value_type_conflict1 local_30;
  
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (result,(long)this->num_col_,&local_30);
  if (this->format_ == kColwise) {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    uVar8 = (ulong)(uint)this->num_col_;
    if (this->num_col_ < 1) {
      uVar8 = uVar9;
    }
    while (uVar10 = uVar9, uVar10 != uVar8) {
      iVar1 = piVar3[uVar10 + 1];
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (col->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar11 = (long)piVar3[uVar10]; uVar9 = uVar10 + 1, lVar11 < iVar1; lVar11 = lVar11 + 1) {
        pdVar7[uVar10] = pdVar6[piVar4[lVar11]] * pdVar5[lVar11] + pdVar7[uVar10];
      }
    }
  }
  else {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    uVar8 = (ulong)(uint)this->num_row_;
    if (this->num_row_ < 1) {
      uVar8 = uVar9;
    }
    while (uVar10 = uVar9, uVar10 != uVar8) {
      iVar1 = piVar3[uVar10 + 1];
      pdVar5 = (col->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar11 = (long)piVar3[uVar10]; uVar9 = uVar10 + 1, lVar11 < iVar1; lVar11 = lVar11 + 1) {
        iVar2 = piVar4[lVar11];
        pdVar7[iVar2] = pdVar5[uVar10] * pdVar6[lVar11] + pdVar7[iVar2];
      }
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTranspose(vector<double>& result,
                                         const vector<double>& col) const {
  assert(this->formatOk());
  assert((int)col.size() >= this->num_row_);
  result.assign(this->num_col_, 0.0);
  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        result[iCol] += col[this->index_[iEl]] * this->value_[iEl];
    }
  } else {
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        result[this->index_[iEl]] += col[iRow] * this->value_[iEl];
    }
  }
}